

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

void CombinationKeygenRecurse<Blob<128>,unsigned_long>
               (unsigned_long *key,int len,int maxlen,unsigned_long *blocks,int blockcount,
               pfHash hash,vector<Blob<128>,_std::allocator<Blob<128>_>_> *hashes)

{
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  code *in_R9;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *unaff_retaddr;
  Blob<128> h;
  int i;
  undefined1 local_3c [4];
  value_type *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar1;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (in_ESI != in_EDX) {
    for (iVar1 = 0; iVar1 < in_R8D; iVar1 = iVar1 + 1) {
      *(undefined8 *)(in_RDI + (long)in_ESI * 8) = *(undefined8 *)(in_RCX + (long)iVar1 * 8);
      Blob<128>::Blob((Blob<128> *)local_3c);
      (*in_R9)(in_RDI,((long)(in_ESI + 1) & 0x1fffffffU) << 3,0,local_3c);
      std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::push_back
                ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)
                 CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffc8);
      CombinationKeygenRecurse<Blob<128>,unsigned_long>
                ((unsigned_long *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RCX >> 0x20),(int)in_RCX,
                 (unsigned_long *)CONCAT44(in_R8D,in_stack_ffffffffffffffe0),
                 (int)((ulong)in_R9 >> 0x20),(pfHash)CONCAT44(iVar1,in_stack_ffffffffffffffd0),
                 unaff_retaddr);
    }
  }
  return;
}

Assistant:

void CombinationKeygenRecurse ( blocktype * key, int len, int maxlen,
                  blocktype * blocks, int blockcount,
                  pfHash hash, std::vector<hashtype> & hashes )
{
  if(len == maxlen) return;  // end recursion

  for(int i = 0; i < blockcount; i++)
  {
    key[len] = blocks[i];

    //if(len == maxlen-1)
    {
      hashtype h;
      hash(key, (len+1) * sizeof(blocktype), 0, &h);
      hashes.push_back(h);
    }

    //else
    {
      CombinationKeygenRecurse(key,len+1,maxlen,blocks,blockcount,hash,hashes);
    }
  }
}